

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseEntityRefInternal(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlChar *pxVar2;
  
  pxVar1 = ctxt->input;
  if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar1 = ctxt->input;
  }
  if (*pxVar1->cur == '&') {
    xmlNextChar(ctxt);
    pxVar2 = xmlParseName(ctxt);
    if (pxVar2 == (xmlChar *)0x0) {
      pxVar2 = (xmlChar *)0x0;
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s","xmlParseEntityRef: no name\n")
      ;
    }
    else if (*ctxt->input->cur == ';') {
      xmlNextChar(ctxt);
    }
    else {
      pxVar2 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,XML_ERR_ENTITYREF_SEMICOL_MISSING,(char *)0x0);
    }
  }
  else {
    pxVar2 = (xmlChar *)0x0;
  }
  return pxVar2;
}

Assistant:

static const xmlChar *
xmlParseEntityRefInternal(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;

    GROW;

    if (RAW != '&')
        return(NULL);
    NEXT;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseEntityRef: no name\n");
        return(NULL);
    }
    if (RAW != ';') {
	xmlFatalErr(ctxt, XML_ERR_ENTITYREF_SEMICOL_MISSING, NULL);
	return(NULL);
    }
    NEXT;

    return(name);
}